

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.h
# Opt level: O1

void __thiscall
wallet::ScriptPubKeyMan::WalletLogPrintf<char_const*,std::__cxx11::string>
          (ScriptPubKeyMan *this,char *fmt,char *parameters,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1)

{
  string_view source_file;
  tinyformat *this_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Logger *pLVar3;
  char **in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  string log_msg;
  allocator<char> local_141;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  long local_120 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  tinyformat *local_f0;
  size_type local_e8;
  size_type local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_140._M_dataplus._M_p = parameters;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,fmt,&local_141);
  pbVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                     (&local_110,0,0,"%s ",3);
  local_f0 = (tinyformat *)(pbVar2->_M_dataplus)._M_p;
  paVar4 = &pbVar2->field_2;
  if (local_f0 == (tinyformat *)paVar4) {
    local_e0 = paVar4->_M_allocated_capacity;
    uStack_d8 = *(undefined4 *)((long)&pbVar2->field_2 + 8);
    uStack_d4 = *(undefined4 *)((long)&pbVar2->field_2 + 0xc);
    local_f0 = (tinyformat *)&local_e0;
  }
  else {
    local_e0 = paVar4->_M_allocated_capacity;
  }
  this_00 = local_f0;
  local_e8 = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  (*this->m_storage->_vptr_WalletStorage[2])(&local_140.field_2);
  pLVar3 = LogInstance();
  bVar1 = BCLog::Logger::Enabled(pLVar3);
  if (bVar1) {
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    tinyformat::format<std::__cxx11::string,char_const*,std::__cxx11::string>
              (&local_70,this_00,local_140.field_2._M_local_buf,&local_140,in_RCX,in_R9);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_50,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    pLVar3 = LogInstance();
    local_70._M_dataplus._M_p = (pointer)0x61;
    local_70._M_string_length = 0x112fc4f;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/scriptpubkeyman.h"
    ;
    source_file._M_len = 0x61;
    str._M_str = local_50._M_dataplus._M_p;
    str._M_len = local_50._M_string_length;
    logging_function._M_str = "WalletLogPrintf";
    logging_function._M_len = 0xf;
    BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x103,ALL,Info);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                               local_50.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((long *)local_140.field_2._M_allocated_capacity != local_120) {
    operator_delete((void *)local_140.field_2._M_allocated_capacity,local_120[0] + 1);
  }
  if (local_f0 != (tinyformat *)&local_e0) {
    operator_delete(local_f0,local_e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WalletLogPrintf(const char* fmt, Params... parameters) const
    {
        LogPrintf(("%s " + std::string{fmt}).c_str(), m_storage.GetDisplayName(), parameters...);
    }